

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall testing::internal::DeathTestImpl::~DeathTestImpl(DeathTestImpl *this)

{
  allocator local_e5;
  int local_e4;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20;
  
  (this->super_DeathTest)._vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_0015a270;
  if (this->read_fd_ == -1) {
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&(this->matcher_).
                    super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  );
    return;
  }
  std::__cxx11::string::string((string *)&local_c0,"CHECK failed: File ",&local_e5);
  std::operator+(&local_a0,&local_c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]lattice/build_O2/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_80,&local_a0,", line ");
  local_e4 = 0x1a2;
  StreamableToString<int>(&local_e0,&local_e4);
  std::operator+(&local_60,&local_80,&local_e0);
  std::operator+(&local_40,&local_60,": ");
  std::operator+(&local_20,&local_40,"read_fd_ == -1");
  DeathTestAbort(&local_20);
}

Assistant:

~DeathTestImpl() override { GTEST_DEATH_TEST_CHECK_(read_fd_ == -1); }